

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O1

int __thiscall anon_unknown.dwarf_25635b::NullBackend::mixerProc(NullBackend *this)

{
  uint uVar1;
  ALuint AVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  ALCdevice *pAVar12;
  ulong uVar13;
  timespec local_40;
  
  pAVar12 = (this->super_BackendBase).mDevice;
  uVar1 = pAVar12->Frequency;
  AVar2 = pAVar12->UpdateSize;
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
    uVar13 = 0;
    uVar3 = (ulong)(AVar2 * 1000) / (ulong)uVar1;
    uVar4 = uVar3 >> 1;
    do {
      if (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) {
        return 0;
      }
      lVar7 = std::chrono::_V2::steady_clock::now();
      pAVar12 = (this->super_BackendBase).mDevice;
      lVar7 = (long)((lVar7 - lVar6) * (ulong)pAVar12->Frequency) / 1000000000;
      lVar8 = lVar7 - uVar13;
      if (lVar8 < (long)(ulong)pAVar12->UpdateSize) {
        uVar11 = uVar4 / 1000;
        lVar7 = (uVar4 % 1000) * 1000000;
        if (1 < (uint)uVar3) {
          do {
            local_40.tv_nsec = lVar7;
            local_40.tv_sec = uVar11;
            iVar5 = nanosleep(&local_40,&local_40);
            if (iVar5 != -1) break;
            piVar9 = __errno_location();
            uVar11 = local_40.tv_sec;
            lVar7 = local_40.tv_nsec;
          } while (*piVar9 == 4);
        }
      }
      else {
        pAVar12 = (this->super_BackendBase).mDevice;
        uVar11 = (ulong)pAVar12->UpdateSize;
        while ((long)uVar11 <= lVar8) {
          ALCdevice::renderSamples(pAVar12,(void *)0x0,(ALuint)uVar11,0);
          pAVar12 = (this->super_BackendBase).mDevice;
          uVar11 = (ulong)pAVar12->UpdateSize;
          uVar13 = uVar13 + uVar11;
          lVar8 = lVar7 - uVar13;
        }
        uVar11 = (ulong)pAVar12->Frequency;
        if ((long)uVar11 <= (long)uVar13) {
          uVar10 = uVar13 / uVar11;
          uVar13 = uVar13 % uVar11;
          lVar6 = lVar6 + uVar10 * 1000000000;
        }
      }
    } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
  }
  return 0;
}

Assistant:

int NullBackend::mixerProc()
{
    const milliseconds restTime{mDevice->UpdateSize*1000/mDevice->Frequency / 2};

    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    int64_t done{0};
    auto start = std::chrono::steady_clock::now();
    while(!mKillNow.load(std::memory_order_acquire)
        && mDevice->Connected.load(std::memory_order_acquire))
    {
        auto now = std::chrono::steady_clock::now();

        /* This converts from nanoseconds to nanosamples, then to samples. */
        int64_t avail{std::chrono::duration_cast<seconds>((now-start) * mDevice->Frequency).count()};
        if(avail-done < mDevice->UpdateSize)
        {
            std::this_thread::sleep_for(restTime);
            continue;
        }
        while(avail-done >= mDevice->UpdateSize)
        {
            mDevice->renderSamples(nullptr, mDevice->UpdateSize, 0u);
            done += mDevice->UpdateSize;
        }

        /* For every completed second, increment the start time and reduce the
         * samples done. This prevents the difference between the start time
         * and current time from growing too large, while maintaining the
         * correct number of samples to render.
         */
        if(done >= mDevice->Frequency)
        {
            seconds s{done/mDevice->Frequency};
            start += s;
            done -= mDevice->Frequency*s.count();
        }
    }

    return 0;
}